

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O0

bool __thiscall
tokenizer::as(tokenizer *this,list<expected_token,_std::allocator<expected_token>_> *rhs)

{
  unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
  *this_00;
  undefined8 __end;
  bool bVar1;
  type_conflict1 tVar2;
  char *pcVar3;
  long lVar4;
  reference t;
  pointer prVar5;
  id_type iVar6;
  pointer peVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  iterator_range_base *piVar10;
  unspecified_bool_type uVar11;
  token_value_type *l;
  ostream *poVar12;
  bool local_422;
  allocator<char> local_401;
  string local_400 [8];
  string rest;
  key_type local_3d4;
  key_type local_3d0;
  int local_3cc;
  const_iterator cStack_3c8;
  int i;
  const_iterator cend_expected;
  const_iterator citer_expected;
  iterator_type end;
  undefined1 local_398 [8];
  iterator_type iter;
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  lexer;
  char *last;
  char *first;
  list<expected_token,_std::allocator<expected_token>_> *rhs_local;
  tokenizer *this_local;
  
  first = (char *)rhs;
  rhs_local = (list<expected_token,_std::allocator<expected_token>_> *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  last = pcVar3;
  lVar4 = std::__cxx11::string::size();
  lexer.
  super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  .self.targetstate.field_2._8_8_ = pcVar3 + lVar4;
  this_00 = &iter.super_type.
             super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
  ;
  cpp_properties::
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::cpp_properties_lexer
            ((cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
              *)this_00);
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,char_const*,boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>>>
  ::begin<char_const*>
            ((lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,char_const*,boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>>>
              *)local_398,(char **)this_00,&last,
             lexer.
             super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
             .self.targetstate.field_2._M_local_buf + 8);
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::end((lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
         *)&citer_expected);
  cend_expected =
       std::__cxx11::list<expected_token,_std::allocator<expected_token>_>::cbegin
                 ((list<expected_token,_std::allocator<expected_token>_> *)first);
  cStack_3c8 = std::__cxx11::list<expected_token,_std::allocator<expected_token>_>::cend
                         ((list<expected_token,_std::allocator<expected_token>_> *)first);
  local_3cc = 0;
  while( true ) {
    bVar1 = boost::spirit::
            multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
            ::operator!=((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)local_398,
                         (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)&citer_expected);
    local_422 = false;
    if (bVar1) {
      t = boost::spirit::
          multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
          ::operator*((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                       *)local_398);
      bVar1 = boost::spirit::lex::lexertl::
              token_is_valid<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>
                        (t);
      local_422 = false;
      if (bVar1) {
        local_422 = std::operator!=(&cend_expected,&stack0xfffffffffffffc38);
      }
    }
    if (local_422 == false) {
      bVar1 = boost::spirit::
              multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
              ::operator==((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                            *)local_398,
                           (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                            *)&citer_expected);
      pcVar3 = last;
      __end = lexer.
              super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
              .self.targetstate.field_2._8_8_;
      if (bVar1) {
        poVar12 = std::operator<<((ostream *)&std::cout,"*** Debug: ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3cc);
        std::operator<<(poVar12," token(s) found\n");
        bVar1 = std::operator!=(&cend_expected,&stack0xfffffffffffffc38);
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,"missing expected tokens\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>(local_400,pcVar3,(char *)__end,&local_401);
        std::allocator<char>::~allocator(&local_401);
        poVar12 = std::operator<<((ostream *)&std::cout,"Lexical analysis failed\n");
        poVar12 = std::operator<<(poVar12,"stopped at: \"");
        poVar12 = std::operator<<(poVar12,local_400);
        std::operator<<(poVar12,"\"\n");
        std::__cxx11::string::~string(local_400);
        this_local._7_1_ = 0;
      }
      goto LAB_0010b539;
    }
    prVar5 = boost::spirit::
             multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
             ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_398);
    iVar6 = boost::spirit::lex::lexertl::
            token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
            ::id((token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                  *)prVar5);
    peVar7 = std::_List_const_iterator<expected_token>::operator->(&cend_expected);
    if (iVar6 != peVar7->id) {
      poVar12 = std::operator<<((ostream *)&std::cout,"state: ");
      prVar5 = boost::spirit::
               multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
               ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                             *)local_398);
      sVar8 = boost::spirit::lex::lexertl::
              token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
              ::state(&prVar5->
                       super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
                     );
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar8);
      poVar12 = std::operator<<(poVar12,", ");
      poVar12 = std::operator<<(poVar12,"id: expected=");
      peVar7 = std::_List_const_iterator<expected_token>::operator->(&cend_expected);
      local_3d0 = (key_type)peVar7->id;
      pmVar9 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->name,&local_3d0);
      poVar12 = std::operator<<(poVar12,(string *)pmVar9);
      poVar12 = std::operator<<(poVar12,", actual=");
      prVar5 = boost::spirit::
               multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
               ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                             *)local_398);
      iVar6 = boost::spirit::lex::lexertl::
              token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
              ::id((token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                    *)prVar5);
      local_3d4 = (key_type)iVar6;
      pmVar9 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->name,&local_3d4);
      poVar12 = std::operator<<(poVar12,(string *)pmVar9);
      poVar12 = std::operator<<(poVar12,", ");
      poVar12 = std::operator<<(poVar12,"string:>");
      prVar5 = boost::spirit::
               multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
               ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                             *)local_398);
      piVar10 = (iterator_range_base *)
                boost::spirit::lex::lexertl::
                token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
                ::value(prVar5);
      uVar11 = boost::iterator_range_detail::iterator_range_base::operator_cast_to__(piVar10);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar11 != 0xffffffffffffffff);
      std::operator<<(poVar12,"<\n");
      this_local._7_1_ = 0;
      goto LAB_0010b539;
    }
    prVar5 = boost::spirit::
             multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
             ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_398);
    l = boost::spirit::lex::lexertl::
        token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>::value
                  (prVar5);
    peVar7 = std::_List_const_iterator<expected_token>::operator->(&cend_expected);
    tVar2 = boost::operator!=(l,&peVar7->value);
    if (tVar2) break;
    local_3cc = local_3cc + 1;
    boost::spirit::
    multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
    ::operator++((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_398);
    std::_List_const_iterator<expected_token>::operator++(&cend_expected);
  }
  poVar12 = std::operator<<((ostream *)&std::cout,"state: ");
  prVar5 = boost::spirit::
           multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
           ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_398);
  sVar8 = boost::spirit::lex::lexertl::
          token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
          ::state(&prVar5->
                   super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
                 );
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar8);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::operator<<(poVar12,"id: ");
  prVar5 = boost::spirit::
           multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
           ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_398);
  iVar6 = boost::spirit::lex::lexertl::
          token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
          ::id((token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                *)prVar5);
  rest.field_2._12_4_ = (undefined4)iVar6;
  pmVar9 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,(key_type *)(rest.field_2._M_local_buf + 0xc));
  poVar12 = std::operator<<(poVar12,(string *)pmVar9);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::operator<<(poVar12,"string: expected=>");
  prVar5 = boost::spirit::
           multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
           ::operator->((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_398);
  piVar10 = (iterator_range_base *)
            boost::spirit::lex::lexertl::
            token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>::
            value(prVar5);
  uVar11 = boost::iterator_range_detail::iterator_range_base::operator_cast_to__(piVar10);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar11 != 0xffffffffffffffff);
  poVar12 = std::operator<<(poVar12,"<, actual=>");
  peVar7 = std::_List_const_iterator<expected_token>::operator->(&cend_expected);
  poVar12 = std::operator<<(poVar12,(string *)&peVar7->value);
  std::operator<<(poVar12,"<\n");
  this_local._7_1_ = 0;
LAB_0010b539:
  boost::spirit::lex::lexertl::
  iterator<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
  ::~iterator((iterator<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
               *)&citer_expected);
  boost::spirit::lex::lexertl::
  iterator<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
  ::~iterator((iterator<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
               *)local_398);
  cpp_properties::
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::~cpp_properties_lexer
            ((cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
              *)&iter.super_type.
                 super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
            );
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool as(const list<value_type>& rhs) {
        char const* first = text.c_str();
        char const* last = &first[text.size()];

        cp::cpp_properties_lexer<lexer_type> lexer;
        lexer_type::iterator_type iter = lexer.begin(first, last);
        lexer_type::iterator_type end = lexer.end();

        list<value_type>::const_iterator citer_expected = rhs.cbegin();
        list<value_type>::const_iterator cend_expected = rhs.cend();

        int i = 0;
        while (iter != end && token_is_valid(*iter) && citer_expected != cend_expected) {
            if (iter->id() != citer_expected->id) {
                std::cout << "state: " << iter->state() << ", "
                            << "id: expected=" << name[citer_expected->id] << ", actual=" << name[iter->id()] << ", "
                          << "string:>" << iter->value() << "<\n";
                return false;
            }
            if (iter->value() != citer_expected->value) {
            std::cout << "state: " << iter->state() << ", "
                      << "id: " << name[iter->id()] << ", "
                      << "string: expected=>" << iter->value() << "<, actual=>" << citer_expected->value << "<\n";
                return false;
            }
            ++i;
            ++iter;
            ++citer_expected;
        }
        if (iter == end) {
            std::cout << "*** Debug: " << i << " token(s) found\n";
            if (citer_expected != cend_expected) {
                std::cout << "missing expected tokens\n";
                return false;
            } else {
                return true;
            }
        } else {
            std::string rest(first, last);
            std::cout << "Lexical analysis failed\n" << "stopped at: \""
                      << rest << "\"\n";
        }
        return false;
    }